

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timetrans.cpp
# Opt level: O0

bool Common2Mjd(COMMONTIME UT,MJDTIME *MJD)

{
  COMMONTIME CT;
  undefined1 auVar1 [16];
  COMMONTIME *pCVar2;
  ushort local_1e;
  ushort local_1c;
  unsigned_short m;
  unsigned_short y;
  bool flag;
  MJDTIME *MJD_local;
  
  pCVar2 = &UT;
  auVar1 = UT._8_16_;
  CT.Sec = (double)pCVar2;
  CT.Year = auVar1._0_2_;
  CT.Month = auVar1._2_2_;
  CT.Day = auVar1._4_2_;
  CT.Hour = auVar1._6_2_;
  CT.Min = auVar1._8_2_;
  CT._10_6_ = auVar1._10_6_;
  MJD_local._7_1_ = isLegal(CT);
  if (MJD_local._7_1_) {
    if (pCVar2->Month < 3) {
      local_1c = pCVar2->Year - 1;
      local_1e = pCVar2->Month + 0xc;
    }
    else {
      local_1c = pCVar2->Year;
      local_1e = pCVar2->Month;
    }
    MJD->Day = (int)((double)local_1c * 365.25) + (int)((double)(local_1e + 1) * 30.6001) +
               (uint)pCVar2->Day + 0x1a4295;
    MJD->FracDay = ((double)pCVar2->Hour + (double)pCVar2->Min / 60.0 + pCVar2->Sec / 3600.0) / 24.0
                   + MJD->FracDay;
    MJD->Day = MJD->Day + -2400000;
    if (1.0 <= MJD->FracDay) {
      MJD->Day = (int)MJD->FracDay + MJD->Day;
      MJD->FracDay = MJD->FracDay - (double)(int)MJD->FracDay;
    }
    MJD_local._7_1_ = true;
  }
  return MJD_local._7_1_;
}

Assistant:

bool Common2Mjd(const COMMONTIME UT, MJDTIME &MJD)
{
    bool flag;
    unsigned short int y, m;

    // 输入合法性检测
    flag = isLegal(UT);
    if(!flag)
        return flag;

    if(UT.Month <= 2)
    {
        y = UT.Year - 1;
        m = UT.Month + 12;
    }
    else
    {
        y = UT.Year;
        m = UT.Month;
    }
    MJD.Day = int(365.25 * y) + int(30.6001 * (m + 1)) + UT.Day + 1720981;
    MJD.FracDay += (UT.Hour + UT.Min / 60.0 + (UT.Sec) / 3600.0) / 24.0;
    MJD.Day -= 2400000;
    // FracDay 合法性检测
    if(MJD.FracDay >= 1)
    {
        MJD.Day += int(MJD.FracDay);
        MJD.FracDay -= int(MJD.FracDay);
    }
    flag = true;

    return flag;
}